

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardplural.cpp
# Opt level: O0

int32_t icu_63::StandardPlural::indexFromString(UnicodeString *keyword,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t i;
  UErrorCode *errorCode_local;
  UnicodeString *keyword_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    keyword_local._4_4_ = indexOrNegativeFromString(keyword);
    if (keyword_local._4_4_ < 0) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      keyword_local._4_4_ = 5;
    }
  }
  else {
    keyword_local._4_4_ = 5;
  }
  return keyword_local._4_4_;
}

Assistant:

int32_t StandardPlural::indexFromString(const UnicodeString &keyword, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) { return OTHER; }
    int32_t i = indexOrNegativeFromString(keyword);
    if (i >= 0) {
        return i;
    } else {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return OTHER;
    }
}